

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int FreeEXRHeader(EXRHeader *exr_header)

{
  long lVar1;
  int i;
  long lVar2;
  
  if (exr_header != (EXRHeader *)0x0) {
    free(exr_header->channels);
    free(exr_header->pixel_types);
    free(exr_header->requested_pixel_types);
    lVar1 = 0x200;
    for (lVar2 = 0; lVar2 < exr_header->num_custom_attributes; lVar2 = lVar2 + 1) {
      free(*(void **)(exr_header->custom_attributes->name + lVar1));
      lVar1 = lVar1 + 0x210;
    }
    free(exr_header->custom_attributes);
    return 0;
  }
  return -3;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  if (exr_header->custom_attributes) {
    free(exr_header->custom_attributes);
  }

  return TINYEXR_SUCCESS;
}